

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImLineClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *p)

{
  ImVec2 local_50;
  ImVec2 local_48;
  float local_40;
  float local_3c;
  float ab_len_sqr;
  float dot;
  ImVec2 ab_dir;
  ImVec2 ap;
  ImVec2 *p_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  
  ab_dir = operator-(p,a);
  _ab_len_sqr = operator-(b,a);
  local_3c = ab_dir.x * ab_len_sqr + ab_dir.y * dot;
  if (0.0 <= local_3c) {
    local_40 = ab_len_sqr * ab_len_sqr + dot * dot;
    if (local_3c <= local_40) {
      local_50 = operator*((ImVec2 *)&ab_len_sqr,local_3c);
      local_48 = operator/(&local_50,local_40);
      a_local = (ImVec2 *)operator+(a,&local_48);
    }
    else {
      a_local = *(ImVec2 **)b;
    }
  }
  else {
    a_local = *(ImVec2 **)a;
  }
  return (ImVec2)a_local;
}

Assistant:

ImVec2 ImLineClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& p)
{
    ImVec2 ap = p - a;
    ImVec2 ab_dir = b - a;
    float dot = ap.x * ab_dir.x + ap.y * ab_dir.y;
    if (dot < 0.0f)
        return a;
    float ab_len_sqr = ab_dir.x * ab_dir.x + ab_dir.y * ab_dir.y;
    if (dot > ab_len_sqr)
        return b;
    return a + ab_dir * dot / ab_len_sqr;
}